

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo2.cpp
# Opt level: O2

int64_t primecount::pi_lmo2(int64_t x)

{
  int iVar1;
  undefined1 x_00 [16];
  bool bVar2;
  ulong uVar3;
  int64_t iVar4;
  size_t size;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long res;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int64_t k_1;
  long lVar11;
  undefined1 in_R9B;
  long lVar12;
  int64_t m;
  long lVar13;
  double dVar14;
  double dVar15;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  type primes;
  Vector<bool,_std::allocator<bool>_> sieve;
  int local_64;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  
  if (x < 2) {
    iVar4 = 0;
  }
  else {
    x_00._8_8_ = in_stack_ffffffffffffff40;
    x_00._0_8_ = in_stack_ffffffffffffff38;
    dVar14 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar15 = cbrt((double)x);
    uVar8 = (ulong)dVar15;
    uVar6 = (long)uVar8 >> 0x3f & uVar8;
    for (; (uVar3 = uVar6, 0 < (long)uVar8 &&
           (uVar3 = uVar8,
           uVar8 * uVar8 - (ulong)x / uVar8 != 0 &&
           (long)((ulong)x / uVar8) <= (long)(uVar8 * uVar8))); uVar8 = uVar8 - 1) {
    }
    lVar7 = uVar3 - 1;
    do {
      lVar12 = lVar7 + 2;
      lVar7 = lVar7 + 1;
    } while (lVar12 * lVar12 - x / lVar12 == 0 || lVar12 * lVar12 < x / lVar12);
    uVar6 = (ulong)(dVar14 * (double)lVar7);
    if (uVar6 < 0x14) {
      uVar8 = (ulong)(byte)PhiTiny::pi[uVar6];
    }
    else {
      uVar8 = 8;
    }
    generate_primes_i32(&primes,uVar6);
    generate_lpf(&lpf,uVar6);
    generate_moebius(&mu,uVar6);
    lVar7 = (long)primes.end_ - (long)primes.array_;
    bVar2 = is_print();
    lVar12 = (lVar7 >> 2) + -1;
    uVar3 = P2((primecount *)x,uVar6,lVar12,1,(uint)bVar2,(bool)in_R9B);
    bVar2 = is_print();
    iVar4 = S1(x,uVar6,uVar8,1,bVar2);
    size = x / (long)uVar6;
    Vector<bool,_std::allocator<bool>_>::Vector(&sieve,size);
    local_64 = 1;
    std::__fill_a1<bool*,int>(sieve.array_,sieve.end_,&local_64);
    lVar13 = uVar8 + 1;
    for (lVar7 = 1; lVar7 != lVar13; lVar7 = lVar7 + 1) {
      iVar1 = primes.array_[lVar7];
      for (lVar9 = (long)iVar1; lVar9 < (long)size; lVar9 = lVar9 + iVar1) {
        sieve.array_[lVar9] = false;
      }
    }
    lVar7 = 0;
    for (; lVar13 < lVar12; lVar13 = lVar13 + 1) {
      lVar11 = (long)primes.array_[lVar13];
      lVar9 = 1;
      lVar10 = 0;
      for (uVar8 = uVar6; (long)uVar6 / lVar11 < (long)uVar8; uVar8 = uVar8 - 1) {
        if (((long)mu.array_[uVar8] != 0) && (primes.array_[lVar13] < lpf.array_[uVar8])) {
          lVar5 = x / (long)(uVar8 * lVar11) + 1;
          if (lVar5 < lVar9) {
            lVar5 = lVar9;
          }
          for (; lVar5 != lVar9; lVar9 = lVar9 + 1) {
            lVar10 = lVar10 + (ulong)sieve.array_[lVar9];
          }
          lVar7 = lVar7 - mu.array_[uVar8] * lVar10;
          lVar9 = lVar5;
        }
      }
      lVar9 = lVar11 * 2;
      for (; lVar11 < (long)size; lVar11 = lVar11 + lVar9) {
        sieve.array_[lVar11] = false;
      }
    }
    Vector<bool,_std::allocator<bool>_>::~Vector(&sieve);
    iVar4 = iVar4 + lVar7 + lVar12 + ~uVar3;
    Vector<int,_std::allocator<int>_>::~Vector(&mu);
    Vector<int,_std::allocator<int>_>::~Vector(&lpf);
    Vector<int,_std::allocator<int>_>::~Vector(&primes);
  }
  return iVar4;
}

Assistant:

int64_t pi_lmo2(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}